

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O1

mecab_path_t * __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::newPath(Allocator<mecab_node_t,_mecab_path_t> *this)

{
  FreeList<mecab_path_t> *pFVar1;
  mecab_path_t *pmVar2;
  
  if ((this->path_freelist_).ptr_ == (FreeList<mecab_path_t> *)0x0) {
    pFVar1 = (FreeList<mecab_path_t> *)operator_new(0x38);
    pFVar1->_vptr_FreeList = (_func_int **)&PTR__FreeList_00172ee0;
    (pFVar1->freeList).super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar1->freeList).super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar1->freeList).super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar1->pi_ = 0;
    pFVar1->li_ = 0;
    pFVar1->size = 0x800;
    (this->path_freelist_).ptr_ = pFVar1;
  }
  pmVar2 = FreeList<mecab_path_t>::alloc((this->path_freelist_).ptr_);
  return pmVar2;
}

Assistant:

P *newPath() {
    if (!path_freelist_.get()) {
      path_freelist_.reset(new FreeList<P>(PATH_FREELIST_SIZE));
    }
    return path_freelist_->alloc();
  }